

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

FlagBase * __thiscall args::HelpFlag::Match(HelpFlag *this,char arg)

{
  FlagBase *pFVar1;
  Help *this_00;
  char in_SIL;
  char in_stack_00000177;
  FlagBase *in_stack_00000178;
  string *in_stack_ffffffffffffff98;
  allocator local_31;
  string local_30 [39];
  char local_9;
  
  local_9 = in_SIL;
  pFVar1 = FlagBase::Match(in_stack_00000178,in_stack_00000177);
  if (pFVar1 != (FlagBase *)0x0) {
    this_00 = (Help *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,1,local_9,&local_31);
    Help::Help(this_00,in_stack_ffffffffffffff98);
    __cxa_throw(this_00,&Help::typeinfo,Help::~Help);
  }
  return (FlagBase *)0x0;
}

Assistant:

virtual FlagBase *Match(const char arg) override
            {
                if (FlagBase::Match(arg))
                {
#ifdef ARGS_NOEXCEPT
                    error = Error::Help;
                    return this;
#else
                    throw Help(std::string(1, arg));
#endif
                }
                return nullptr;
            }